

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryCopy
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryCopy *curr)

{
  ExternalInterface *pEVar1;
  long *plVar2;
  Name memory;
  Name memory_00;
  char cVar3;
  Literal *pLVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  Address memorySize;
  Address memorySize_00;
  Address AVar8;
  Address AVar9;
  uint64_t uVar10;
  undefined1 local_1a8 [8];
  Flow dest;
  Flow source;
  Flow size;
  anon_union_16_5_9943fe1e_for_Literal_0 local_b8;
  undefined8 local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  ulong local_90;
  Flow *local_88;
  undefined1 local_80 [8];
  MemoryInstanceInfo destInfo;
  MemoryInstanceInfo sourceInfo;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_1a8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->source);
    if (source.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&source.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        pLVar4 = Flow::getSingleValue((Flow *)local_1a8);
        uVar5 = Literal::getUnsigned(pLVar4);
        pLVar4 = Flow::getSingleValue((Flow *)&dest.breakTo.super_IString.str._M_str);
        uVar6 = Literal::getUnsigned(pLVar4);
        pLVar4 = Flow::getSingleValue((Flow *)&source.breakTo.super_IString.str._M_str);
        uVar7 = Literal::getUnsigned(pLVar4);
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_80,this,(Name)(curr->destMemory).super_IString.str);
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)&destInfo.name.super_IString.str._M_str,this,
                   (Name)(curr->sourceMemory).super_IString.str);
        memory.super_IString.str._M_str = (char *)destInfo.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)destInfo.instance;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_80,memory);
        memory_00.super_IString.str._M_str = (char *)sourceInfo.name.super_IString.str._M_len;
        memory_00.super_IString.str._M_len = (size_t)sourceInfo.instance;
        local_88 = __return_storage_ptr__;
        memorySize_00 =
             getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)
                           destInfo.name.super_IString.str._M_str,memory_00);
        if ((((memorySize_00.addr << 0x10 < uVar6 + uVar7) || (CARRY8(uVar7,uVar5))) ||
            (uVar6 + uVar7 < uVar6)) || (memorySize.addr << 0x10 < uVar7 + uVar5)) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.copy");
        }
        uVar10 = 0;
        local_98 = uVar7;
        if (uVar6 < uVar5) {
          uVar10 = uVar7 - 1;
          local_98 = 0xffffffffffffffff;
        }
        local_90 = -(ulong)(uVar6 < uVar5) | 1;
        while (local_98 != uVar10) {
          pEVar1 = *(ExternalInterface **)((long)local_80 + 0x288);
          size.breakTo.super_IString.str._M_str = (char *)(uVar5 + uVar10);
          AVar8 = getFinalAddressWithoutOffset
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_80,
                             (Literal *)&size.breakTo.super_IString.str._M_str,1,memorySize);
          plVar2 = *(long **)(destInfo.name.super_IString.str._M_str + 0x288);
          local_b8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(uVar6 + uVar10);
          local_a8 = 3;
          local_a0 = uVar10;
          AVar9 = getFinalAddressWithoutOffset
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)
                             destInfo.name.super_IString.str._M_str,(Literal *)&local_b8.func,1,
                             memorySize_00);
          cVar3 = (**(code **)(*plVar2 + 0x68))
                            (plVar2,AVar9.addr,sourceInfo.instance,
                             sourceInfo.name.super_IString.str._M_len);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar8.addr,(ulong)(uint)(int)cVar3,destInfo.instance,
                     destInfo.name.super_IString.str._M_len);
          Literal::~Literal((Literal *)&local_b8.func);
          Literal::~Literal((Literal *)&size.breakTo.super_IString.str._M_str);
          uVar10 = local_a0 + local_90;
        }
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_88->breakTo).super_IString.str._M_len = 0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
        super_IString.str._M_str = (char *)0x0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (local_88->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
        (local_88->breakTo).super_IString.str._M_str = (char *)0x0;
        __return_storage_ptr__ = local_88;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&source.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&source.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&dest.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&dest.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1a8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryCopy(MemoryCopy* curr) {
    NOTE_ENTER("MemoryCopy");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow source = self()->visit(curr->source);
    if (source.breaking()) {
      return source;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(source);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sourceVal(source.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto destInfo = getMemoryInstanceInfo(curr->destMemory);
    auto sourceInfo = getMemoryInstanceInfo(curr->sourceMemory);
    auto destMemorySize = destInfo.instance->getMemorySize(destInfo.name);
    auto sourceMemorySize = sourceInfo.instance->getMemorySize(sourceInfo.name);
    if (sourceVal + sizeVal > sourceMemorySize * Memory::kPageSize ||
        destVal + sizeVal > destMemorySize * Memory::kPageSize ||
        // FIXME: better/cheaper way to detect wrapping?
        sourceVal + sizeVal < sourceVal || sourceVal + sizeVal < sizeVal ||
        destVal + sizeVal < destVal || destVal + sizeVal < sizeVal) {
      trap("out of bounds segment access in memory.copy");
    }

    int64_t start = 0;
    int64_t end = sizeVal;
    int step = 1;
    // Reverse direction if source is below dest
    if (sourceVal < destVal) {
      start = int64_t(sizeVal) - 1;
      end = -1;
      step = -1;
    }
    for (int64_t i = start; i != end; i += step) {
      destInfo.instance->externalInterface->store8(
        destInfo.instance->getFinalAddressWithoutOffset(
          Literal(destVal + i), 1, destMemorySize),
        sourceInfo.instance->externalInterface->load8s(
          sourceInfo.instance->getFinalAddressWithoutOffset(
            Literal(sourceVal + i), 1, sourceMemorySize),
          sourceInfo.name),
        destInfo.name);
    }
    return {};
  }